

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parson.c
# Opt level: O3

size_t json_array_get_string_len(JSON_Array *array,size_t index)

{
  JSON_Value *pJVar1;
  
  if ((((array != (JSON_Array *)0x0) && (index < array->count)) &&
      (pJVar1 = array->items[index], pJVar1 != (JSON_Value *)0x0)) && (pJVar1->type == 2)) {
    return (pJVar1->value).string.length;
  }
  return 0;
}

Assistant:

size_t json_array_get_string_len(const JSON_Array *array, size_t index) {
    return json_value_get_string_len(json_array_get_value(array, index));
}